

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

int xmlOutputBufferWriteString(xmlOutputBufferPtr out,char *str)

{
  size_t sVar1;
  int len;
  char *str_local;
  xmlOutputBufferPtr out_local;
  
  if ((out == (xmlOutputBufferPtr)0x0) || (out->error != 0)) {
    out_local._4_4_ = -1;
  }
  else if (str == (char *)0x0) {
    out_local._4_4_ = -1;
  }
  else {
    sVar1 = strlen(str);
    out_local._4_4_ = (int)sVar1;
    if (0 < out_local._4_4_) {
      out_local._4_4_ = xmlOutputBufferWrite(out,out_local._4_4_,str);
    }
  }
  return out_local._4_4_;
}

Assistant:

int
xmlOutputBufferWriteString(xmlOutputBufferPtr out, const char *str) {
    int len;

    if ((out == NULL) || (out->error)) return(-1);
    if (str == NULL)
        return(-1);
    len = strlen(str);

    if (len > 0)
	return(xmlOutputBufferWrite(out, len, str));
    return(len);
}